

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O2

Cba_Man_t * Prs_ManBuildCbaVerilog(char *pFileName,Vec_Ptr_t *vDes)

{
  int *piVar1;
  Vec_Int_t *pVVar2;
  uint nCapMin;
  uint nCapMin_00;
  Hash_IntMan_t *pHVar3;
  int iVar4;
  int iVar5;
  Prs_Ntk_t *pPVar6;
  Abc_Nam_t *pAVar7;
  Abc_Nam_t *pAVar8;
  Abc_Nam_t *pAVar9;
  Cba_Man_t *pCVar10;
  char *pcVar11;
  size_t sVar12;
  Cba_Ntk_t *pCVar13;
  Vec_Ptr_t *p;
  int iVar14;
  Cba_Man_t *p_00;
  uint uVar15;
  int local_3c;
  Cba_Man_t *local_38;
  
  pPVar6 = Prs_ManRoot(vDes);
  pAVar7 = Abc_NamRef(pPVar6->pStrs);
  pAVar8 = Abc_NamRef(pPVar6->pFuns);
  pAVar9 = Abc_NamStart(100,0x18);
  iVar14 = vDes->nSize;
  pHVar3 = pPVar6->vHash;
  piVar1 = &pHVar3->nRefs;
  *piVar1 = *piVar1 + 1;
  pCVar10 = (Cba_Man_t *)calloc(1,0x658);
  local_38 = pCVar10;
  pcVar11 = Extra_FileDesignName(pFileName);
  pCVar10->pName = pcVar11;
  if (pFileName == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar12 = strlen(pFileName);
    pcVar11 = (char *)malloc(sVar12 + 1);
    strcpy(pcVar11,pFileName);
  }
  p_00 = local_38;
  local_38->pSpec = pcVar11;
  if (pAVar7 == (Abc_Nam_t *)0x0) {
    pAVar7 = Abc_NamStart(1000,0x18);
  }
  p_00->pStrs = pAVar7;
  pAVar7 = pAVar8;
  if (pAVar8 == (Abc_Nam_t *)0x0) {
    pAVar7 = Abc_NamStart(100,0x18);
  }
  p_00->pFuns = pAVar7;
  if (pAVar9 == (Abc_Nam_t *)0x0) {
    pAVar9 = Abc_NamStart(100,0x18);
  }
  p_00->pMods = pAVar9;
  p_00->vHash = pHVar3;
  if (pAVar8 == (Abc_Nam_t *)0x0) {
    Abc_NamStrFindOrAdd(pAVar7,"1\'b0",(int *)0x0);
    Abc_NamStrFindOrAdd(pAVar7,"1\'b1",(int *)0x0);
    Abc_NamStrFindOrAdd(pAVar7,"1\'bx",(int *)0x0);
    Abc_NamStrFindOrAdd(pAVar7,"1\'bz",(int *)0x0);
  }
  p = &pCVar10->vNtks;
  Vec_PtrGrow(p,iVar14 + 1);
  Vec_PtrPush(p,(void *)0x0);
  p_00->iRoot = 1;
  iVar14 = 0;
  while( true ) {
    iVar4 = vDes->nSize;
    if (iVar4 <= iVar14) {
      iVar14 = 0;
      while (iVar14 < iVar4) {
        pPVar6 = (Prs_Ntk_t *)Vec_PtrEntry(vDes,iVar14);
        pcVar11 = Prs_NtkStr(pPVar6,pPVar6->iModuleName);
        printf("Building module \"%s\"...\n",pcVar11);
        iVar14 = iVar14 + 1;
        pCVar13 = Cba_ManNtk(p_00,iVar14);
        Prs_CreateVerilogNtk(pCVar13,pPVar6);
        iVar4 = vDes->nSize;
      }
      iVar14 = 1;
      while( true ) {
        if ((p_00->vNtks).nSize <= iVar14) {
          return p_00;
        }
        pCVar13 = Cba_ManNtk(p_00,iVar14);
        if ((pCVar13->vSeq).nSize != 0) break;
        iVar4 = Cba_NtkIsSeq(pCVar13);
        if (iVar4 != 0) {
          for (iVar4 = 1; iVar4 < (pCVar13->vObjType).nSize; iVar4 = iVar4 + 1) {
            iVar5 = Cba_ObjIsBox(pCVar13,iVar4);
            if (iVar5 != 0) {
              iVar5 = Cba_ObjIsSeq(pCVar13,iVar4);
              if (iVar5 != 0) {
                Vec_IntPush(&pCVar13->vSeq,iVar4);
              }
            }
          }
        }
        iVar14 = iVar14 + 1;
      }
      __assert_fail("Cba_NtkBoxSeqNum(p) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                    ,0x295,"void Cba_NtkPrepareSeq(Cba_Ntk_t *)");
    }
    pPVar6 = (Prs_Ntk_t *)Vec_PtrEntry(vDes,iVar14);
    iVar4 = pPVar6->iModuleName;
    nCapMin = (pPVar6->vInputs).nSize;
    nCapMin_00 = (pPVar6->vOutputs).nSize;
    uVar15 = nCapMin_00 + nCapMin + (pPVar6->vInouts).nSize + (pPVar6->vObjs).nSize;
    pCVar13 = (Cba_Ntk_t *)calloc(1,0x1b0);
    p_00 = local_38;
    if ((int)(nCapMin_00 | nCapMin | uVar15) < 0) break;
    pCVar13->Id = (local_38->vNtks).nSize;
    Vec_PtrPush(p,pCVar13);
    pCVar13->NameId = iVar4;
    pCVar13->pDesign = p_00;
    Vec_IntGrow(&pCVar13->vInputs,nCapMin);
    Vec_IntGrow(&pCVar13->vOutputs,nCapMin_00);
    Vec_StrGrow(&pCVar13->vObjType,uVar15 + 1);
    Vec_StrPush(&pCVar13->vObjType,'\0');
    pVVar2 = &pCVar13->vObjFin0;
    Vec_IntGrow(pVVar2,uVar15 + 2);
    Vec_IntPush(pVVar2,0);
    Vec_IntPush(pVVar2,1);
    pVVar2 = &pCVar13->vObjFon0;
    Vec_IntGrow(pVVar2,uVar15 + 2);
    Vec_IntPush(pVVar2,0);
    Vec_IntPush(pVVar2,1);
    Vec_IntGrow(&pCVar13->vFinFon,0x65);
    Vec_IntPush(&pCVar13->vFinFon,0);
    Vec_IntGrow(&pCVar13->vFonObj,0x65);
    Vec_IntPush(&pCVar13->vFonObj,0);
    Prs_CreateVerilogPio(pCVar13,pPVar6);
    pAVar7 = p_00->pMods;
    pcVar11 = Cba_NtkName(pCVar13);
    iVar4 = Abc_NamStrFindOrAdd(pAVar7,pcVar11,&local_3c);
    if (local_3c == 0) {
      if (iVar4 != pCVar13->Id) {
        __assert_fail("NtkId == pNtk->Id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x264,"void Cba_NtkAdd(Cba_Man_t *, Cba_Ntk_t *)");
      }
    }
    else {
      pcVar11 = Cba_NtkName(pCVar13);
      printf("Network with name \"%s\" already exists.\n",pcVar11);
    }
    iVar14 = iVar14 + 1;
  }
  __assert_fail("nIns >= 0 && nOuts >= 0 && nObjs >= 0 && nFins >= 0 && nFons >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                ,0x212,"Cba_Ntk_t *Cba_NtkAlloc(Cba_Man_t *, int, int, int, int, int, int)");
}

Assistant:

Cba_Man_t * Prs_ManBuildCbaVerilog( char * pFileName, Vec_Ptr_t * vDes )
{
    Prs_Ntk_t * pPrsNtk; int i, fError = 0;
    Prs_Ntk_t * pPrsRoot = Prs_ManRoot(vDes);
    // start the manager
    Abc_Nam_t * pStrs = Abc_NamRef(pPrsRoot->pStrs);
    Abc_Nam_t * pFuns = Abc_NamRef(pPrsRoot->pFuns);
    Abc_Nam_t * pMods = Abc_NamStart( 100, 24 );
    Cba_Man_t * p = Cba_ManAlloc( pFileName, Vec_PtrSize(vDes), pStrs, pFuns, pMods, Hash_IntManRef(pPrsRoot->vHash) );
    // initialize networks
    Vec_PtrForEachEntry( Prs_Ntk_t *, vDes, pPrsNtk, i )
    {
        Cba_Ntk_t * pNtk = Cba_NtkAlloc( p, Prs_NtkId(pPrsNtk), Prs_NtkPiNum(pPrsNtk), Prs_NtkPoNum(pPrsNtk), Prs_NtkObjNum(pPrsNtk), 100, 100 );
        Prs_CreateVerilogPio( pNtk, pPrsNtk );
        Cba_NtkAdd( p, pNtk );
    }
    // create networks
    Vec_PtrForEachEntry( Prs_Ntk_t *, vDes, pPrsNtk, i )
    {
        printf( "Building module \"%s\"...\n", Prs_NtkName(pPrsNtk) );
        fError = Prs_CreateVerilogNtk( Cba_ManNtk(p, i+1), pPrsNtk );
        if ( fError )
            break;
    }
    if ( fError )
        printf( "Quitting because of errors.\n" );
    else
        Cba_ManPrepareSeq( p );
    return p;
}